

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test-internal.h
# Opt level: O1

void __thiscall
testing::internal::InternalRunDeathTestFlag::~InternalRunDeathTestFlag
          (InternalRunDeathTestFlag *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (-1 < this->write_fd_) {
    close(this->write_fd_);
  }
  pcVar1 = (this->file_)._M_dataplus._M_p;
  paVar2 = &(this->file_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~InternalRunDeathTestFlag() {
    if (write_fd_ >= 0)
      posix::Close(write_fd_);
  }